

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O0

bool __thiscall
QParallelAnimationGroupPrivate::shouldAnimationStart
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation,bool startIfAtEnd)

{
  bool bVar1;
  int iVar2;
  parameter_type pVar3;
  byte in_DL;
  QAbstractAnimation *in_RDI;
  int dura;
  QParallelAnimationGroupPrivate *in_stack_ffffffffffffffc8;
  bool local_29;
  bool local_1;
  
  iVar2 = QAbstractAnimation::totalDuration(in_RDI);
  if (iVar2 == -1) {
    bVar1 = isUncontrolledAnimationFinished(in_stack_ffffffffffffffc8,in_RDI);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else if ((in_DL & 1) == 0) {
    pVar3 = ::QObjectCompatProperty::operator_cast_to_Direction
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                        *)0x67d114);
    if (pVar3 == Forward) {
      local_1 = *(int *)((long)&in_RDI[8].super_QObject._vptr_QObject + 4) < iVar2;
    }
    else {
      local_29 = false;
      if (*(int *)((long)&in_RDI[8].super_QObject._vptr_QObject + 4) != 0) {
        local_29 = *(int *)((long)&in_RDI[8].super_QObject._vptr_QObject + 4) <= iVar2;
      }
      local_1 = local_29;
    }
  }
  else {
    local_1 = *(int *)((long)&in_RDI[8].super_QObject._vptr_QObject + 4) <= iVar2;
  }
  return local_1;
}

Assistant:

bool QParallelAnimationGroupPrivate::shouldAnimationStart(QAbstractAnimation *animation, bool startIfAtEnd) const
{
    const int dura = animation->totalDuration();
    if (dura == -1)
        return !isUncontrolledAnimationFinished(animation);
    if (startIfAtEnd)
        return currentTime <= dura;
    if (direction == QAbstractAnimation::Forward)
        return currentTime < dura;
    else //direction == QAbstractAnimation::Backward
        return currentTime && currentTime <= dura;
}